

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmGhsMultiTargetGenerator::WriteTargetSpecifics
          (cmGhsMultiTargetGenerator *this,ostream *fout,string *config)

{
  string *psVar1;
  ostream *poVar2;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string outpath;
  string binpath;
  char *local_110;
  char *local_108;
  char local_100;
  undefined7 uStack_ff;
  long *local_f0;
  undefined8 local_e8;
  long local_e0 [2];
  string local_d0;
  string local_b0;
  string local_78;
  undefined1 *local_58;
  undefined8 local_50;
  undefined8 local_48;
  long *local_40;
  long **local_38;
  
  local_108 = (char *)0x0;
  local_100 = '\0';
  local_110 = &local_100;
  if (this->TagType != SUBPROJECT) {
    psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                       (&this->LocalGenerator->super_cmLocalGenerator);
    (*(this->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter._vptr_cmOutputConverter
      [0x10])(&local_f0,this->LocalGenerator,this->GeneratorTarget);
    local_78._M_string_length = (size_type)(psVar1->_M_dataplus)._M_p;
    local_78._M_dataplus._M_p = (pointer)psVar1->_M_string_length;
    local_78.field_2._M_allocated_capacity = 0;
    local_b0.field_2._M_allocated_capacity = (long)&local_b0.field_2 + 8;
    local_b0._M_dataplus._M_p = (pointer)0x0;
    local_b0._M_string_length = 1;
    local_b0.field_2._M_local_buf[8] = '/';
    local_78.field_2._8_8_ = 1;
    local_50 = 0;
    local_48 = local_e8;
    local_40 = local_f0;
    views._M_len = 3;
    views._M_array = (iterator)&local_78;
    local_58 = (undefined1 *)local_b0.field_2._M_allocated_capacity;
    local_38 = &local_f0;
    cmCatViews(&local_d0,views);
    if (local_f0 != local_e0) {
      operator_delete(local_f0,local_e0[0] + 1);
    }
    cmGeneratorTarget::GetDirectory(&local_b0,this->GeneratorTarget,config,RuntimeBinaryArtifact);
    cmSystemTools::RelativePath(&local_78,&local_d0,&local_b0);
    std::__cxx11::string::operator=((string *)&local_110,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,(ulong)(local_b0.field_2._M_allocated_capacity + 1))
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>(fout,"    :binDirRelative=\"",0x15);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(fout,local_110,(long)local_108);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"\n    -o \"",10);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(this->TargetNameReal)._M_dataplus._M_p,
                        (this->TargetNameReal)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::_M_replace((ulong)&local_110,0,local_108,0x8360a4);
  std::__ostream_insert<char,std::char_traits<char>>(fout,"    :outputDirRelative=\"",0x18);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(fout,local_110,(long)local_108);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"\n",2);
  if (local_110 != &local_100) {
    operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteTargetSpecifics(std::ostream& fout,
                                                     const std::string& config)
{
  std::string outpath;

  /* Determine paths from the target project file to where the output artifacts
   * need to be located.
   */
  if (this->TagType != GhsMultiGpj::SUBPROJECT) {
    // set target binary file destination
    std::string binpath = cmStrCat(
      this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
      this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget));
    outpath = cmSystemTools::RelativePath(
      binpath, this->GeneratorTarget->GetDirectory(config));
    /* clang-format off */
    fout << "    :binDirRelative=\"" << outpath << "\"\n"
            "    -o \"" << this->TargetNameReal << "\"\n";
    /* clang-format on */
  }

  // set target object file destination
  outpath = ".";
  fout << "    :outputDirRelative=\"" << outpath << "\"\n";
}